

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O2

bool goodform::can_be<unsigned_long>(any *v)

{
  float __x;
  double __x_00;
  double dVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  short *psVar5;
  int *piVar6;
  long *plVar7;
  float *pfVar8;
  double *pdVar9;
  float fVar10;
  
  bVar3 = is<signed_char>(v);
  if (bVar3) {
    pcVar4 = std::any_cast<signed_char_const&>(v);
    bVar3 = *pcVar4 < '\0';
  }
  else {
    bVar3 = is<short>(v);
    if (bVar3) {
      psVar5 = std::any_cast<short_const&>(v);
      bVar3 = *psVar5 < 0;
    }
    else {
      bVar3 = is<int>(v);
      if (bVar3) {
        piVar6 = std::any_cast<int_const&>(v);
        bVar3 = *piVar6 < 0;
      }
      else {
        bVar3 = is<long>(v);
        if (!bVar3) {
          bVar3 = is<unsigned_char>(v);
          if (bVar3) {
            std::any_cast<unsigned_char_const&>(v);
          }
          else {
            bVar3 = is<unsigned_short>(v);
            if (bVar3) {
              std::any_cast<unsigned_short_const&>(v);
            }
            else {
              bVar3 = is<unsigned_int>(v);
              if (bVar3) {
                std::any_cast<unsigned_int_const&>(v);
              }
              else {
                bVar3 = is<unsigned_long>(v);
                if (!bVar3) {
                  bVar3 = is<float>(v);
                  if (bVar3) {
                    pfVar8 = std::any_cast<float_const&>(v);
                    __x = *pfVar8;
                    fVar10 = floorf(__x);
                    bVar2 = __x <= 1.8446744e+19 && fVar10 == __x;
                    bVar3 = __x < 0.0;
                  }
                  else {
                    bVar3 = is<double>(v);
                    if (!bVar3) {
                      bVar3 = is<unsigned_long>(v);
                      return bVar3;
                    }
                    pdVar9 = std::any_cast<double_const&>(v);
                    __x_00 = *pdVar9;
                    dVar1 = floor(__x_00);
                    bVar2 = __x_00 <= 1.8446744073709552e+19 && dVar1 == __x_00;
                    bVar3 = __x_00 < 0.0;
                  }
                  return (bool)(!bVar3 & -bVar2);
                }
                std::any_cast<unsigned_long_const&>(v);
              }
            }
          }
          return true;
        }
        plVar7 = std::any_cast<long_const&>(v);
        bVar3 = *plVar7 < 0;
      }
    }
  }
  return !bVar3;
}

Assistant:

bool can_be(const any& v)
  {
    if (std::is_integral<T>::value)
    {
      if (is<std::int8_t>(v)) return detail::can_int_fit_value<T>(get<std::int8_t>(v));
      if (is<std::int16_t>(v)) return detail::can_int_fit_value<T>(get<std::int16_t>(v));
      if (is<std::int32_t>(v)) return detail::can_int_fit_value<T>(get<std::int32_t>(v));
      if (is<std::int64_t>(v)) return detail::can_int_fit_value<T>(get<std::int64_t>(v));
      if (is<std::uint8_t>(v)) return detail::can_int_fit_value<T>(get<std::uint8_t>(v));
      if (is<std::uint16_t>(v)) return detail::can_int_fit_value<T>(get<std::uint16_t>(v));
      if (is<std::uint32_t>(v)) return detail::can_int_fit_value<T>(get<std::uint32_t>(v));
      if (is<std::uint64_t>(v)) return detail::can_int_fit_value<T>(get<std::uint64_t>(v));
      if (is<float>(v))
      {
        float tmp = get<float>(v);
        return std::floor(tmp) == tmp && float(std::numeric_limits<T>::max()) >= tmp && float(std::numeric_limits<T>::min()) <= tmp;
      }
      if (is<double>(v))
      {
        double tmp = get<double>(v);
        return std::floor(tmp) == tmp && double(std::numeric_limits<T>::max()) >= tmp && double(std::numeric_limits<T>::min()) <= tmp;
      }
    }
    else if (std::is_same<T, double>::value)
    {
      return true;
    }
    else if (std::is_same<T, float>::value)
    {
      if (!is<double>(v))
        return true;
      else
      {
        float tmp = float(get<double>(v));
        if (double(tmp) == get<double>(v))
          return true;
      }
    }
    return is<T>(v);
  }